

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int unixFileControl(sqlite3_file *id,int op,void *pArg)

{
  long sz;
  sqlite3_io_methods *psVar1;
  uchar mask;
  uint uVar2;
  int iVar3;
  char *pcVar4;
  sqlite3_io_methods *psVar5;
  int *piVar6;
  long offset;
  long lVar7;
  long lVar8;
  undefined1 local_c0 [48];
  long local_90;
  int local_88;
  
  iVar3 = 0xc;
  switch(op) {
  case 1:
    uVar2 = (uint)*(byte *)((long)&id[3].pMethods + 4);
    goto LAB_00141628;
  case 4:
    uVar2 = *(uint *)&id[4].pMethods;
    goto LAB_00141628;
  case 5:
    sz = *pArg;
    if (0 < *(int *)&id[9].pMethods) {
      iVar3 = (*aSyscall[5].pCurrent)((ulong)*(uint *)&id[3].pMethods,local_c0);
      if (iVar3 != 0) {
        return 0x70a;
      }
      lVar8 = sz + *(int *)&id[9].pMethods + -1;
      lVar8 = lVar8 - lVar8 % (long)*(int *)&id[9].pMethods;
      if (local_90 < lVar8) {
        lVar7 = (long)local_88;
        offset = ~(local_90 % lVar7) + local_90;
        while (offset = offset + lVar7, offset < lVar7 + lVar8 + -1) {
          if (lVar8 <= offset) {
            offset = lVar8 + -1;
          }
          iVar3 = seekAndWrite((unixFile *)id,offset,"",1);
          if (iVar3 != 1) {
            return 0x30a;
          }
        }
      }
    }
    iVar3 = 0;
    if ((0 < (long)id[0xc].pMethods) && ((long)id[10].pMethods < sz)) {
      if ((*(int *)&id[9].pMethods < 1) &&
         (iVar3 = robust_ftruncate(*(int *)&id[3].pMethods,sz), iVar3 != 0)) {
        piVar6 = __errno_location();
        *(int *)&id[4].pMethods = *piVar6;
        iVar3 = 0x60a;
        unixLogErrorAtLine(0x60a,"ftruncate",(char *)id[7].pMethods,0x8e2a);
      }
      else {
        iVar3 = unixMapfile((unixFile *)id,sz);
      }
    }
    break;
  case 6:
    *(undefined4 *)&id[9].pMethods = *pArg;
    goto LAB_0014162b;
  case 10:
    mask = '\x04';
    goto LAB_00141612;
  case 0xc:
    iVar3 = 0;
    pcVar4 = sqlite3_mprintf("%s",(id[1].pMethods)->xWrite);
    *(char **)pArg = pcVar4;
    break;
  case 0xd:
    mask = '\x10';
LAB_00141612:
    unixModeBit((unixFile *)id,mask,(int *)pArg);
    goto LAB_0014162b;
  case 0x10:
    pcVar4 = (char *)sqlite3_malloc64((long)*(int *)&(id[1].pMethods)->xClose);
    iVar3 = 0;
    if (pcVar4 != (char *)0x0) {
      unixGetTempname(*(int *)&(id[1].pMethods)->xClose,pcVar4);
      *(char **)pArg = pcVar4;
    }
    break;
  case 0x12:
    psVar5 = (sqlite3_io_methods *)sqlite3Config.mxMmap;
    if ((long)*pArg < sqlite3Config.mxMmap) {
      psVar5 = *pArg;
    }
    psVar1 = id[0xc].pMethods;
    *(sqlite3_io_methods **)pArg = psVar1;
    iVar3 = 0;
    if (((psVar5 != psVar1 && -1 < (long)psVar5) && (*(int *)((long)&id[9].pMethods + 4) == 0)) &&
       (id[0xc].pMethods = psVar5, 0 < (long)id[10].pMethods)) {
      unixUnmapfile((unixFile *)id);
      iVar3 = unixMapfile((unixFile *)id,-1);
      return iVar3;
    }
    break;
  case 0x14:
    uVar2 = fileHasMoved((unixFile *)id);
LAB_00141628:
    *(uint *)pArg = uVar2;
LAB_0014162b:
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

static int unixFileControl(sqlite3_file *id, int op, void *pArg){
  unixFile *pFile = (unixFile*)id;
  switch( op ){
#if defined(__linux__) && defined(SQLITE_ENABLE_BATCH_ATOMIC_WRITE)
    case SQLITE_FCNTL_BEGIN_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_START_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_BEGIN_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_COMMIT_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_COMMIT_ATOMIC_WRITE);
      return rc ? SQLITE_IOERR_COMMIT_ATOMIC : SQLITE_OK;
    }
    case SQLITE_FCNTL_ROLLBACK_ATOMIC_WRITE: {
      int rc = osIoctl(pFile->h, F2FS_IOC_ABORT_VOLATILE_WRITE);
      return rc ? SQLITE_IOERR_ROLLBACK_ATOMIC : SQLITE_OK;
    }
#endif /* __linux__ && SQLITE_ENABLE_BATCH_ATOMIC_WRITE */

    case SQLITE_FCNTL_LOCKSTATE: {
      *(int*)pArg = pFile->eFileLock;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_LAST_ERRNO: {
      *(int*)pArg = pFile->lastErrno;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_CHUNK_SIZE: {
      pFile->szChunk = *(int *)pArg;
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_SIZE_HINT: {
      int rc;
      SimulateIOErrorBenign(1);
      rc = fcntlSizeHint(pFile, *(i64 *)pArg);
      SimulateIOErrorBenign(0);
      return rc;
    }
    case SQLITE_FCNTL_PERSIST_WAL: {
      unixModeBit(pFile, UNIXFILE_PERSIST_WAL, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_POWERSAFE_OVERWRITE: {
      unixModeBit(pFile, UNIXFILE_PSOW, (int*)pArg);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_VFSNAME: {
      *(char**)pArg = sqlite3_mprintf("%s", pFile->pVfs->zName);
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_TEMPFILENAME: {
      char *zTFile = sqlite3_malloc64( pFile->pVfs->mxPathname );
      if( zTFile ){
        unixGetTempname(pFile->pVfs->mxPathname, zTFile);
        *(char**)pArg = zTFile;
      }
      return SQLITE_OK;
    }
    case SQLITE_FCNTL_HAS_MOVED: {
      *(int*)pArg = fileHasMoved(pFile);
      return SQLITE_OK;
    }
#ifdef SQLITE_ENABLE_SETLK_TIMEOUT
    case SQLITE_FCNTL_LOCK_TIMEOUT: {
      pFile->iBusyTimeout = *(int*)pArg;
      return SQLITE_OK;
    }
#endif
#if SQLITE_MAX_MMAP_SIZE>0
    case SQLITE_FCNTL_MMAP_SIZE: {
      i64 newLimit = *(i64*)pArg;
      int rc = SQLITE_OK;
      if( newLimit>sqlite3GlobalConfig.mxMmap ){
        newLimit = sqlite3GlobalConfig.mxMmap;
      }

      /* The value of newLimit may be eventually cast to (size_t) and passed
      ** to mmap(). Restrict its value to 2GB if (size_t) is not at least a
      ** 64-bit type. */
      if( newLimit>0 && sizeof(size_t)<8 ){
        newLimit = (newLimit & 0x7FFFFFFF);
      }

      *(i64*)pArg = pFile->mmapSizeMax;
      if( newLimit>=0 && newLimit!=pFile->mmapSizeMax && pFile->nFetchOut==0 ){
        pFile->mmapSizeMax = newLimit;
        if( pFile->mmapSize>0 ){
          unixUnmapfile(pFile);
          rc = unixMapfile(pFile, -1);
        }
      }
      return rc;
    }
#endif
#ifdef SQLITE_DEBUG
    /* The pager calls this method to signal that it has done
    ** a rollback and that the database is therefore unchanged and
    ** it hence it is OK for the transaction change counter to be
    ** unchanged.
    */
    case SQLITE_FCNTL_DB_UNCHANGED: {
      ((unixFile*)id)->dbUpdate = 0;
      return SQLITE_OK;
    }
#endif
#if SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__)
    case SQLITE_FCNTL_SET_LOCKPROXYFILE:
    case SQLITE_FCNTL_GET_LOCKPROXYFILE: {
      return proxyFileControl(id,op,pArg);
    }
#endif /* SQLITE_ENABLE_LOCKING_STYLE && defined(__APPLE__) */
  }
  return SQLITE_NOTFOUND;
}